

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# random.c
# Opt level: O2

void cio_random_get_bytes(cio_rng_t *rng,void *bytes,size_t num_bytes)

{
  ulong uVar1;
  size_t i;
  byte bVar2;
  uint8_t *dest;
  uint uVar3;
  
  for (i = 0; num_bytes != i; i = i + 1) {
    uVar1 = rng->state;
    uVar3 = (uint)(uVar1 >> 0x2d) ^ (uint)(uVar1 >> 0x1b);
    bVar2 = (byte)(uVar1 >> 0x3b);
    rng->state = uVar1 * 0x5851f42d4c957f2d + rng->inc;
    *(byte *)((long)bytes + i) = (byte)(uVar3 >> bVar2) | (byte)(uVar3 << 0x20 - bVar2);
  }
  return;
}

Assistant:

void cio_random_get_bytes(cio_rng_t *rng, void *bytes, size_t num_bytes)
{
	uint8_t *dest = bytes;
	for (size_t i = 0; i < num_bytes; i++) {
		*dest = (uint8_t)pcg32_random_r(rng);
		dest++;
	}
}